

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putRGBcontig8bitCMYKMaptile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  TIFFRGBValue *pTVar2;
  ushort uVar3;
  uint16_t k;
  uint16_t b;
  uint16_t g;
  uint16_t r;
  TIFFRGBValue *Map;
  uint32_t local_28;
  int samplesperpixel;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  uVar1 = img->samplesperpixel;
  pTVar2 = img->Map;
  _y_local = cp;
  for (local_28 = h; w_local = w, local_28 != 0; local_28 = local_28 - 1) {
    for (; w_local != 0; w_local = w_local - 1) {
      uVar3 = 0xff - pp[3];
      *_y_local = CONCAT12(pTVar2[(ushort)((int)((uint)uVar3 * (0xff - (uint)pp[2])) / 0xff)],
                           CONCAT11(pTVar2[(ushort)((int)((uint)uVar3 * (0xff - (uint)pp[1])) / 0xff
                                                   )],
                                    pTVar2[(ushort)((int)((uint)uVar3 * (0xff - (uint)*pp)) / 0xff)]
                                   )) | 0xff000000;
      pp = pp + (int)(uint)uVar1;
      _y_local = _y_local + 1;
    }
    pp = pp + (int)((uint)uVar1 * fromskew);
    _y_local = _y_local + toskew;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig8bitCMYKMaptile)
{
    int samplesperpixel = img->samplesperpixel;
    TIFFRGBValue *Map = img->Map;
    uint16_t r, g, b, k;

    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            k = 255 - pp[3];
            r = (k * (255 - pp[0])) / 255;
            g = (k * (255 - pp[1])) / 255;
            b = (k * (255 - pp[2])) / 255;
            *cp++ = PACK(Map[r], Map[g], Map[b]);
            pp += samplesperpixel;
        }
        pp += fromskew;
        cp += toskew;
    }
}